

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O3

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  ImDrawList *pIVar1;
  ImDrawVert *pIVar2;
  ImDrawCmd *pIVar3;
  code *pcVar4;
  float fVar5;
  float fVar6;
  undefined4 fb_width;
  undefined4 fb_height;
  uint uVar7;
  unsigned_short *puVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_texture;
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  long local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_a8._0_4_ = (undefined4)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  local_a8._4_4_ = (undefined4)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  local_a8._8_8_ = 0;
  auVar12 = vpcmpeqd_avx(local_a8,ZEXT416(0) << 0x20);
  auVar12 = vpmovsxdq_avx(auVar12);
  if ((auVar12 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 && -1 < auVar12[0xf]) {
    glGetIntegerv(0x8069,&local_b4);
    glGetIntegerv(0xb40,&local_b0);
    glGetIntegerv(0xba2,&local_88);
    glGetIntegerv(0xc10,&local_98);
    glGetIntegerv(0xb54,&local_b8);
    glGetTexEnviv(0x2300,0x2200,&local_bc);
    glPushAttrib(0x7000);
    fb_width = local_a8._0_4_;
    fb_height = local_a8._4_4_;
    ImGui_ImplOpenGL2_SetupRenderState(draw_data,local_a8._0_4_,local_a8._4_4_);
    if (0 < draw_data->CmdListsCount) {
      local_a8._8_8_ = 0;
      local_a8._0_4_ = (draw_data->DisplayPos).x;
      local_a8._4_4_ = (draw_data->DisplayPos).y;
      register0x00001248 = 0;
      local_68._0_4_ = (draw_data->FramebufferScale).x;
      local_68._4_4_ = (draw_data->FramebufferScale).y;
      fVar11 = (float)(int)fb_height;
      local_48 = vmovshdup_avx(_local_68);
      local_58 = vmovshdup_avx(local_a8);
      lVar9 = 0;
      do {
        pIVar1 = draw_data->CmdLists[lVar9];
        puVar8 = (pIVar1->IdxBuffer).Data;
        pIVar2 = (pIVar1->VtxBuffer).Data;
        local_70 = lVar9;
        glVertexPointer(2,0x1406,0x14,pIVar2);
        glTexCoordPointer(2,0x1406,0x14,&pIVar2->uv);
        glColorPointer(4,0x1401,0x14,&pIVar2->col);
        if (0 < (pIVar1->CmdBuffer).Size) {
          lVar9 = 0;
          lVar10 = 0;
          do {
            pIVar3 = (pIVar1->CmdBuffer).Data;
            pcVar4 = *(code **)((long)&pIVar3->UserCallback + lVar9);
            if (pcVar4 == (code *)0x0) {
              fVar5 = (*(float *)((long)&(pIVar3->ClipRect).x + lVar9) - (float)local_a8._0_4_) *
                      (float)local_68._0_4_;
              if ((fVar5 < (float)(int)fb_width) &&
                 (fVar6 = (*(float *)((long)&(pIVar3->ClipRect).y + lVar9) - (float)local_58._0_4_)
                          * (float)local_48._0_4_, fVar6 < fVar11)) {
                auVar12._8_8_ = 0;
                auVar12._0_8_ = *(ulong *)((long)&(pIVar3->ClipRect).z + lVar9);
                auVar12 = vsubps_avx(auVar12,local_a8);
                auVar13._0_4_ = auVar12._0_4_ * (float)local_68._0_4_;
                auVar13._4_4_ = auVar12._4_4_ * (float)local_68._4_4_;
                auVar13._8_4_ = auVar12._8_4_ * fStack_60;
                auVar13._12_4_ = auVar12._12_4_ * fStack_5c;
                auVar12 = vcmpps_avx(ZEXT816(0) << 0x40,auVar13,2);
                auVar12 = vshufps_avx(auVar12,auVar12,0x50);
                uVar7 = vmovmskpd_avx(auVar12);
                if (((uVar7 & 1) != 0) && ((byte)((byte)uVar7 >> 1) != 0)) {
                  auVar12 = vmovshdup_avx(auVar13);
                  glScissor((int)fVar5,(int)(fVar11 - auVar12._0_4_),(int)(auVar13._0_4_ - fVar5),
                            (int)(auVar12._0_4_ - fVar6));
                  glBindTexture(0xde1,*(undefined4 *)((long)&pIVar3->TextureId + lVar9));
                  glDrawElements(4,*(undefined4 *)((long)&pIVar3->ElemCount + lVar9),0x1403,puVar8);
                }
              }
            }
            else if (pcVar4 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width,fb_height);
            }
            else {
              (*pcVar4)(pIVar1,(long)&(pIVar3->ClipRect).x + lVar9);
            }
            puVar8 = puVar8 + *(uint *)((long)&pIVar3->ElemCount + lVar9);
            lVar10 = lVar10 + 1;
            lVar9 = lVar9 + 0x38;
          } while (lVar10 < (pIVar1->CmdBuffer).Size);
        }
        lVar9 = local_70 + 1;
      } while (lVar9 < draw_data->CmdListsCount);
    }
    glDisableClientState(0x8076);
    glDisableClientState(0x8078);
    glDisableClientState(0x8074);
    glBindTexture(0xde1,local_b4);
    glMatrixMode(0x1700);
    glPopMatrix();
    glMatrixMode(0x1701);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(0x404,local_b0);
    glPolygonMode(0x405,local_ac);
    glViewport(local_88,local_84,local_80,local_7c);
    glScissor(local_98,local_94,local_90,local_8c);
    glShadeModel(local_b8);
    glTexEnvi(0x2300,0x2200,local_bc);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model; glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer);
                }
            }
            idx_buffer += pcmd->ElemCount;
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}